

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Node * getNodeType(UA_Server *server,UA_Node *node)

{
  UA_Boolean UVar1;
  ulong local_80;
  size_t i;
  UA_NodeId *parentId;
  anon_union_16_4_621dfe33_for_identifier local_68;
  UA_NodeId *local_58;
  anon_union_16_4_621dfe33_for_identifier local_50;
  byte local_39;
  UA_NodeId *pUStack_38;
  UA_Boolean inverse;
  UA_NodeId parentRef;
  UA_Node *node_local;
  UA_Server *server_local;
  
  parentRef.identifier.string.data = (UA_Byte *)node;
  if ((node->nodeClass == UA_NODECLASS_VARIABLE) || (node->nodeClass == UA_NODECLASS_OBJECT)) {
    UA_NODEID_NUMERIC((UA_NodeId *)&local_58,0,0x28);
    pUStack_38 = local_58;
    parentRef.namespaceIndex = local_50.numeric._0_2_;
    parentRef._2_2_ = local_50.numeric._2_2_;
    parentRef.identifierType = local_50.string.length._4_4_;
    parentRef.identifier.string.length = (size_t)local_50.string.data;
    local_39 = 0;
  }
  else {
    if (((node->nodeClass != UA_NODECLASS_VARIABLETYPE) &&
        (node->nodeClass != UA_NODECLASS_REFERENCETYPE)) &&
       (node->nodeClass != UA_NODECLASS_DATATYPE)) {
      return (UA_Node *)0x0;
    }
    UA_NODEID_NUMERIC((UA_NodeId *)&parentId,0,0x2d);
    pUStack_38 = parentId;
    parentRef.namespaceIndex = local_68.numeric._0_2_;
    parentRef._2_2_ = local_68.numeric._2_2_;
    parentRef.identifierType = local_68.string.length._4_4_;
    parentRef.identifier.string.length = (size_t)local_68.string.data;
    local_39 = 1;
  }
  i = 0;
  local_80 = 0;
  do {
    if (*(ulong *)(parentRef.identifier.string.data + 0x80) <= local_80) {
LAB_00125efb:
      if (i == 0) {
        server_local = (UA_Server *)0x0;
      }
      else {
        server_local = (UA_Server *)UA_NodeStore_get(server->nodestore,(UA_NodeId *)i);
      }
      return (UA_Node *)server_local;
    }
    if (((*(byte *)(*(long *)(parentRef.identifier.string.data + 0x88) + local_80 * 0x50 + 0x18) & 1
         ) == (local_39 & 1)) &&
       (UVar1 = UA_NodeId_equal((UA_NodeId *)
                                (*(long *)(parentRef.identifier.string.data + 0x88) +
                                local_80 * 0x50),(UA_NodeId *)&stack0xffffffffffffffc8), UVar1)) {
      i = *(long *)(parentRef.identifier.string.data + 0x88) + local_80 * 0x50 + 0x20;
      goto LAB_00125efb;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

const UA_Node *
getNodeType(UA_Server *server, const UA_Node *node) {
    /* The reference to the parent is different for variable and variabletype */
    UA_NodeId parentRef;
    UA_Boolean inverse;
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASTYPEDEFINITION);
        inverse = false;
    } else if(node->nodeClass == UA_NODECLASS_VARIABLETYPE ||
              /* node->nodeClass == UA_NODECLASS_OBJECTTYPE || // objecttype may have multiple parents */
              node->nodeClass == UA_NODECLASS_REFERENCETYPE ||
              node->nodeClass == UA_NODECLASS_DATATYPE) {
        parentRef = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
        inverse = true;
    } else {
        return NULL;
    }

    /* stop at the first matching candidate */
    UA_NodeId *parentId = NULL;
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(node->references[i].isInverse == inverse &&
           UA_NodeId_equal(&node->references[i].referenceTypeId, &parentRef)) {
            parentId = &node->references[i].targetId.nodeId;
            break;
        }
    }

    if(!parentId)
        return NULL;
    return UA_NodeStore_get(server->nodestore, parentId);
}